

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[66],kj::ArrayPtr<char_const>,kj::ArrayPtr<char>>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [66],
               ArrayPtr<const_char> *params_1,ArrayPtr<char> *params_2)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  long lVar6;
  String *result;
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[66]>
            (&local_78,(kj *)params,(char (*) [66])CONCAT44(in_register_00000014,severity));
  pcVar1 = params_1->ptr;
  sVar2 = params_1->size_;
  heapString(&local_60,sVar2);
  if (sVar2 != 0) {
    if ((char *)local_60.content.size_ != (char *)0x0) {
      local_60.content.size_ = (size_t)local_60.content.ptr;
    }
    memcpy((void *)local_60.content.size_,pcVar1,sVar2);
  }
  pcVar1 = params_2->ptr;
  sVar2 = params_2->size_;
  heapString(&local_48,sVar2);
  if (sVar2 != 0) {
    if ((char *)local_48.content.size_ != (char *)0x0) {
      local_48.content.size_ = (size_t)local_48.content.ptr;
    }
    memcpy((void *)local_48.content.size_,pcVar1,sVar2);
  }
  argValues.ptr._4_4_ = severity;
  argValues.ptr._0_4_ = line;
  argValues.size_ = (size_t)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_78,argValues);
  lVar6 = 0x30;
  do {
    lVar3 = *(long *)((long)&local_78.content.ptr + lVar6);
    if (lVar3 != 0) {
      uVar4 = *(undefined8 *)((long)&local_78.content.size_ + lVar6);
      *(undefined8 *)((long)&local_78.content.ptr + lVar6) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar6) = 0;
      puVar5 = *(undefined8 **)((long)&local_78.content.disposer + lVar6);
      (**(code **)*puVar5)(puVar5,lVar3,1,uVar4,uVar4,0);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}